

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O0

void brotli::StoreMetaBlockHeader
               (size_t len,bool is_uncompressed,size_t *storage_ix,uint8_t *storage)

{
  uint8_t *storage_local;
  size_t *storage_ix_local;
  bool is_uncompressed_local;
  size_t len_local;
  
  WriteBits(1,0,storage_ix,storage);
  if (len < 0x10001) {
    WriteBits(2,0,storage_ix,storage);
    WriteBits(0x10,len - 1,storage_ix,storage);
  }
  else {
    WriteBits(2,1,storage_ix,storage);
    WriteBits(0x14,len - 1,storage_ix,storage);
  }
  WriteBits(1,(ulong)is_uncompressed,storage_ix,storage);
  return;
}

Assistant:

static void StoreMetaBlockHeader(
    size_t len, bool is_uncompressed, size_t* storage_ix, uint8_t* storage) {
  // ISLAST
  WriteBits(1, 0, storage_ix, storage);
  if (len <= (1U << 16)) {
    // MNIBBLES is 4
    WriteBits(2, 0, storage_ix, storage);
    WriteBits(16, len - 1, storage_ix, storage);
  } else {
    // MNIBBLES is 5
    WriteBits(2, 1, storage_ix, storage);
    WriteBits(20, len - 1, storage_ix, storage);
  }
  // ISUNCOMPRESSED
  WriteBits(1, is_uncompressed, storage_ix, storage);
}